

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O2

void av1_update_level_info(AV1_COMP *cpi,size_t size,int64_t ts_start,int64_t ts_end)

{
  int *piVar1;
  double dVar2;
  BITSTREAM_PROFILE profile;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  AV1_PRIMARY *pAVar11;
  SequenceHeader *pSVar12;
  AV1LevelInfo *level_info;
  long lVar13;
  SequenceHeader *pSVar14;
  int frames_in_pool;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  TARGET_LEVEL_FAIL_ID TVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  FRAME_BUFFER *pFVar25;
  int iVar26;
  DFG_INTERVAL *pDVar27;
  int *piVar28;
  size_t sVar29;
  int iVar30;
  uint uVar31;
  int iVar32;
  FRAME_BUFFER *pFVar33;
  int *piVar34;
  int iVar35;
  double *pdVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  DECODER_MODEL *decoder_model;
  bool bVar41;
  double dVar42;
  double dVar43;
  undefined1 auVar44 [16];
  double dVar45;
  double dVar46;
  double dVar47;
  undefined1 auVar48 [16];
  int local_e4;
  int local_e0;
  uint local_dc;
  
  pAVar11 = cpi->ppi;
  iVar18 = (cpi->common).superres_upscaled_width;
  iVar5 = (cpi->common).width;
  uVar6 = (cpi->common).tiles.cols;
  uVar31 = (cpi->common).tiles.rows;
  iVar15 = uVar31 * uVar6;
  uVar39 = 0;
  uVar21 = 0;
  if (0 < (int)uVar6) {
    uVar21 = (ulong)uVar6;
  }
  uVar37 = (ulong)uVar31;
  if ((int)uVar31 < 1) {
    uVar37 = uVar39;
  }
  piVar34 = &(cpi->tile_data->tile_info).mi_col_end;
  piVar1 = &(cpi->common).superres_upscaled_width;
  iVar7 = (cpi->common).height;
  iVar8 = cpi->frame_header_count;
  iVar9 = (cpi->common).show_frame;
  iVar10 = (cpi->common).show_existing_frame;
  local_dc = 1;
  local_e0 = 0x7fffffff;
  local_e4 = 0;
  iVar35 = 0x7fffffff;
  iVar30 = 0;
  for (; uVar39 != uVar37; uVar39 = uVar39 + 1) {
    for (lVar40 = 0; uVar21 * 0x5d10 - lVar40 != 0; lVar40 = lVar40 + 0x5d10) {
      iVar17 = *(int *)((long)piVar34 + lVar40 + -4);
      iVar22 = *(int *)((long)piVar34 + lVar40) - iVar17;
      iVar26 = *(int *)((long)piVar34 + lVar40 + -0xc);
      iVar16 = (*(int *)((long)piVar34 + lVar40 + -8) - iVar26) * iVar22 * 0x10;
      if (local_e4 <= iVar16) {
        local_e4 = iVar16;
      }
      iVar16 = (int)((uint)(cpi->common).superres_scale_denominator * 4 * iVar22) / 8;
      if (iVar30 <= iVar16) {
        iVar30 = iVar16;
      }
      iVar17 = iVar5 + iVar17 * -4;
      iVar26 = iVar7 + iVar26 * -4;
      if (iVar17 <= local_e0) {
        local_e0 = iVar17;
      }
      if (iVar26 <= iVar35) {
        iVar35 = iVar26;
      }
      if (*(int *)((long)piVar34 + lVar40) != (cpi->common).mi_params.mi_cols) {
        local_dc = (int)((uint)(iVar5 != iVar18) << 4 | 0xf) < iVar22 & local_dc;
      }
    }
    piVar34 = piVar34 + (long)(int)uVar6 * 0x1744;
  }
  iVar18 = iVar18 * iVar7;
  dVar42 = av1_get_compression_ratio(&cpi->common,size);
  pSVar12 = (cpi->common).seq_params;
  profile = pSVar12->profile;
  bVar3 = pSVar12->still_picture;
  uVar31 = 1 << ((char)(cpi->common).spatial_layer_id + 8U & 0x1f) |
           1 << ((byte)(cpi->common).temporal_layer_id & 0x1f);
  auVar44._8_4_ = (int)(size >> 0x20);
  auVar44._0_8_ = size;
  auVar44._12_4_ = 0x45300000;
  lVar40 = 0;
  do {
    if (pSVar12->operating_points_cnt_minus_1 < lVar40) {
      return;
    }
    if (((pSVar12->operating_point_idc[lVar40] == 0) ||
        ((pSVar12->operating_point_idc[lVar40] & uVar31) == uVar31)) &&
       (((pAVar11->level_params).keep_level_stats >> ((uint)lVar40 & 0x1f) & 1) != 0)) {
      level_info = (pAVar11->level_params).level_info[lVar40];
      iVar17 = (level_info->level_stats).max_tile_size;
      iVar26 = (level_info->level_stats).max_superres_tile_width;
      if (iVar17 <= local_e4) {
        iVar17 = local_e4;
      }
      (level_info->level_stats).max_tile_size = iVar17;
      if (iVar26 <= iVar30) {
        iVar26 = iVar30;
      }
      (level_info->level_stats).max_superres_tile_width = iVar26;
      iVar17 = (level_info->level_stats).min_cropped_tile_width;
      if (local_e0 <= iVar17) {
        iVar17 = local_e0;
      }
      (level_info->level_stats).min_cropped_tile_width = iVar17;
      iVar17 = (level_info->level_stats).min_cropped_tile_height;
      if (iVar35 <= iVar17) {
        iVar17 = iVar35;
      }
      (level_info->level_stats).min_cropped_tile_height = iVar17;
      piVar34 = &(level_info->level_stats).tile_width_is_valid;
      *piVar34 = *piVar34 & local_dc;
      iVar17 = (level_info->level_stats).min_frame_width;
      if (iVar5 <= iVar17) {
        iVar17 = iVar5;
      }
      (level_info->level_stats).min_frame_width = iVar17;
      iVar17 = (level_info->level_stats).min_frame_height;
      if (iVar7 <= iVar17) {
        iVar17 = iVar7;
      }
      (level_info->level_stats).min_frame_height = iVar17;
      dVar43 = (level_info->level_stats).min_cr;
      if (dVar42 <= dVar43) {
        dVar43 = dVar42;
      }
      (level_info->level_stats).min_cr = dVar43;
      (level_info->level_stats).total_compressed_size =
           (level_info->level_stats).total_compressed_size +
           (auVar44._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)size) - 4503599627370496.0);
      iVar17 = (level_info->level_spec).max_picture_size;
      if (iVar17 <= iVar18) {
        iVar17 = iVar18;
      }
      (level_info->level_spec).max_picture_size = iVar17;
      iVar17 = (level_info->level_spec).max_h_size;
      iVar26 = *piVar1;
      if (iVar26 < iVar17) {
        iVar26 = iVar17;
      }
      (level_info->level_spec).max_h_size = iVar26;
      iVar17 = (level_info->level_spec).max_v_size;
      if (iVar17 <= iVar7) {
        iVar17 = iVar7;
      }
      (level_info->level_spec).max_v_size = iVar17;
      uVar19 = (level_info->level_spec).max_tile_cols;
      if ((int)uVar19 <= (int)uVar6) {
        uVar19 = uVar6;
      }
      (level_info->level_spec).max_tile_cols = uVar19;
      iVar17 = (level_info->level_spec).max_tiles;
      if (iVar17 <= iVar15) {
        iVar17 = iVar15;
      }
      (level_info->level_spec).max_tiles = iVar17;
      iVar17 = (level_info->frame_window_buffer).num;
      if (iVar17 < 0x100) {
        (level_info->frame_window_buffer).num = iVar17 + 1;
        iVar16 = (level_info->frame_window_buffer).start;
        iVar26 = iVar17;
        iVar17 = iVar17 + 1;
      }
      else {
        iVar16 = ((level_info->frame_window_buffer).start + 1) % 0x100;
        (level_info->frame_window_buffer).start = iVar16;
        iVar26 = iVar17 + -1;
      }
      iVar26 = (iVar26 + iVar16) % 0x100;
      (level_info->frame_window_buffer).buf[iVar26].ts_start = ts_start;
      (level_info->frame_window_buffer).buf[iVar26].ts_end = ts_end;
      (level_info->frame_window_buffer).buf[iVar26].encoded_size_in_bytes = size;
      (level_info->frame_window_buffer).buf[iVar26].pic_size = iVar18;
      (level_info->frame_window_buffer).buf[iVar26].frame_header_count = iVar8;
      (level_info->frame_window_buffer).buf[iVar26].tiles = iVar15;
      (level_info->frame_window_buffer).buf[iVar26].show_frame = iVar9;
      (level_info->frame_window_buffer).buf[iVar26].show_existing_frame = iVar10;
      if (iVar9 != 0) {
        uVar21 = (long)(iVar16 + iVar17 + -1) % 0x100;
        uVar39 = uVar21 & 0xffffffff;
        lVar23 = (level_info->frame_window_buffer).buf[(int)uVar21].ts_end;
        if (lVar23 < 0x989681) {
          lVar23 = 10000000;
        }
        uVar21 = uVar21 & 0xffffffff;
        iVar26 = 1;
        for (iVar16 = iVar17 + -2; -1 < iVar16; iVar16 = iVar16 + -1) {
          iVar22 = (int)uVar21;
          uVar21 = (ulong)(iVar22 - 1);
          if (iVar22 < 1) {
            uVar21 = 0xff;
          }
          if (((level_info->frame_window_buffer).buf[(int)uVar21].show_frame != 0) &&
             ((level_info->frame_window_buffer).buf[(int)uVar21].ts_start < lVar23 + -10000000))
          break;
          iVar26 = iVar26 + 1;
        }
        if (iVar17 < iVar26) {
          iVar26 = iVar17;
        }
        iVar17 = 0;
        if (iVar26 < 1) {
          iVar26 = iVar17;
        }
        iVar16 = 0;
        lVar38 = 0;
        lVar23 = 0;
        lVar24 = 0;
        while (bVar41 = iVar26 != 0, iVar26 = iVar26 + -1, bVar41) {
          iVar22 = (int)uVar39;
          if ((level_info->frame_window_buffer).buf[iVar22].show_existing_frame == 0) {
            iVar17 = iVar17 + (level_info->frame_window_buffer).buf[iVar22].frame_header_count;
            lVar23 = lVar23 + (level_info->frame_window_buffer).buf[iVar22].pic_size;
          }
          if ((level_info->frame_window_buffer).buf[iVar22].show_frame != 0) {
            lVar38 = lVar38 + (level_info->frame_window_buffer).buf[iVar22].pic_size;
          }
          iVar16 = iVar16 + (level_info->frame_window_buffer).buf[iVar22].tiles;
          lVar24 = lVar24 + (level_info->frame_window_buffer).buf[iVar22].encoded_size_in_bytes;
          uVar39 = (ulong)(iVar22 - 1);
          if (iVar22 < 1) {
            uVar39 = 0xff;
          }
        }
        iVar26 = (level_info->level_stats).max_bitrate;
        iVar22 = (level_info->level_spec).max_header_rate;
        if (iVar17 < iVar22) {
          iVar17 = iVar22;
        }
        (level_info->level_spec).max_header_rate = iVar17;
        lVar13 = (level_info->level_spec).max_display_rate;
        if (lVar38 < lVar13) {
          lVar38 = lVar13;
        }
        (level_info->level_spec).max_display_rate = lVar38;
        lVar38 = (level_info->level_spec).max_decode_rate;
        if (lVar23 < lVar38) {
          lVar23 = lVar38;
        }
        (level_info->level_spec).max_decode_rate = lVar23;
        iVar17 = (level_info->level_spec).max_tile_rate;
        if (iVar16 < iVar17) {
          iVar16 = iVar17;
        }
        (level_info->level_spec).max_tile_rate = iVar16;
        uVar21 = lVar24 << 3;
        if (0x7ffffffe < uVar21) {
          uVar21 = 0x7fffffff;
        }
        iVar17 = (int)uVar21;
        if ((int)uVar21 < iVar26) {
          iVar17 = iVar26;
        }
        (level_info->level_stats).max_bitrate = iVar17;
        (level_info->level_stats).total_time_encoded =
             (double)((cpi->time_stamps).prev_ts_end - (cpi->time_stamps).prev_ts_start) /
             10000000.0 + (level_info->level_stats).total_time_encoded;
      }
      pdVar36 = &level_info->decoder_models[0].frame_buffer_pool[0].presentation_time;
      pFVar33 = level_info->decoder_models[0].frame_buffer_pool;
      for (lVar23 = 0; lVar23 != 0x1c; lVar23 = lVar23 + 1) {
        if (level_info->decoder_models[lVar23].status == '\0') {
          decoder_model = level_info->decoder_models + lVar23;
          iVar17 = (cpi->common).show_existing_frame;
          iVar16 = (cpi->common).height * (cpi->common).superres_upscaled_width;
          iVar26 = (cpi->common).show_frame;
          decoder_model->num_frame = decoder_model->num_frame + 1;
          if (iVar17 == 0) {
            decoder_model->num_decoded_frame = decoder_model->num_decoded_frame + 1;
          }
          if (iVar26 != 0 || iVar17 != 0) {
            decoder_model->num_shown_frame = decoder_model->num_shown_frame + 1;
          }
          sVar29 = decoder_model->coded_bits + size * 8;
          decoder_model->coded_bits = sVar29;
          if (iVar17 == 0) {
            iVar22 = decoder_model->decoder_buffer_delay;
            dVar43 = get_removal_time((uint)decoder_model->mode,decoder_model->num_decoded_frame,
                                      iVar22,decoder_model->frame_buffer_pool,
                                      decoder_model->current_time);
            if (0.0 <= dVar43) {
              dVar45 = decoder_model->removal_time;
              decoder_model->removal_time = dVar43;
              dVar46 = (double)decoder_model->decode_samples / (dVar43 - dVar45);
              decoder_model->decode_samples = iVar16;
              dVar45 = decoder_model->max_decode_rate;
              if (decoder_model->max_decode_rate <= dVar46) {
                dVar45 = dVar46;
              }
              decoder_model->max_decode_rate = dVar45;
              dVar46 = (double)(iVar22 + decoder_model->encoder_buffer_delay) / -90000.0 + dVar43;
              dVar45 = decoder_model->last_bit_arrival_time;
              if (decoder_model->last_bit_arrival_time <= dVar46) {
                dVar45 = dVar46;
              }
              decoder_model->first_bit_arrival_time = dVar45;
              auVar48._8_4_ = (int)(sVar29 >> 0x20);
              auVar48._0_8_ = sVar29;
              auVar48._12_4_ = 0x45300000;
              dVar46 = ((auVar48._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)sVar29) - 4503599627370496.0)) /
                       decoder_model->bit_rate + dVar45;
              decoder_model->last_bit_arrival_time = dVar46;
              if ((dVar46 <= dVar43) || (decoder_model->is_low_delay_mode != false)) {
                decoder_model->coded_bits = 0;
                iVar22 = (decoder_model->dfg_interval_queue).head;
                iVar32 = (decoder_model->dfg_interval_queue).size;
                while( true ) {
                  dVar2 = (decoder_model->dfg_interval_queue).buf[iVar22].removal_time;
                  if (dVar46 < dVar2) break;
                  dVar47 = (decoder_model->dfg_interval_queue).total_interval;
                  if (iVar32 < 1) goto LAB_001b676b;
                  if (1.0 < (dVar2 - dVar45) + dVar47) goto LAB_001b67ae;
                  pDVar27 = (decoder_model->dfg_interval_queue).buf + iVar22;
                  (decoder_model->dfg_interval_queue).total_interval =
                       dVar47 - (pDVar27->last_bit_arrival_time - pDVar27->first_bit_arrival_time);
                  iVar22 = (iVar22 + 1) % 0x40;
                  (decoder_model->dfg_interval_queue).head = iVar22;
                  iVar32 = iVar32 + -1;
                  (decoder_model->dfg_interval_queue).size = iVar32;
                }
                dVar47 = (decoder_model->dfg_interval_queue).total_interval;
LAB_001b676b:
                (decoder_model->dfg_interval_queue).size = iVar32 + 1;
                iVar22 = (iVar22 + iVar32) % 0x40;
                (decoder_model->dfg_interval_queue).buf[iVar22].first_bit_arrival_time = dVar45;
                (decoder_model->dfg_interval_queue).buf[iVar22].last_bit_arrival_time = dVar46;
                (decoder_model->dfg_interval_queue).buf[iVar22].removal_time = dVar43;
                dVar47 = (dVar46 - dVar45) + dVar47;
                (decoder_model->dfg_interval_queue).total_interval = dVar47;
                if (1.0 < dVar47) {
LAB_001b67ae:
                  decoder_model->status = '\x06';
                }
                else {
                  for (lVar38 = 0; lVar38 != 0xf0; lVar38 = lVar38 + 0x18) {
                    if ((((0 < *(int *)((long)pdVar36 + lVar38 + -0xc)) &&
                         (0.0 <= *(double *)((long)pdVar36 + lVar38))) &&
                        (*(double *)((long)pdVar36 + lVar38) <= dVar43)) &&
                       (*(undefined4 *)((long)pdVar36 + lVar38 + -0xc) = 0,
                       *(int *)((long)pdVar36 + lVar38 + -0x10) == 0)) {
                      *(undefined4 *)((long)pdVar36 + lVar38 + -8) = 0xffffffff;
                      *(undefined8 *)((long)pdVar36 + lVar38) = 0xbff0000000000000;
                    }
                  }
                  bVar4 = (cpi->common).current_frame.frame_type;
                  piVar28 = &(cpi->common).height;
                  piVar34 = piVar1;
                  if ((bVar4 & 0xfd) != 0) {
                    pSVar14 = (cpi->common).seq_params;
                    piVar34 = &pSVar14->max_frame_width;
                    piVar28 = &pSVar14->max_frame_height;
                  }
                  decoder_model->current_time =
                       dVar43 + (double)(*piVar34 * *piVar28) / (double)decoder_model->decode_rate;
                  pFVar25 = pFVar33;
                  for (lVar38 = 0; lVar38 != 10; lVar38 = lVar38 + 1) {
                    if ((pFVar25->decoder_ref_count == 0) && (pFVar25->player_ref_count == 0)) {
                      pFVar25->frame_type = bVar4;
                      update_ref_buffers(decoder_model,(int)lVar38,
                                         (cpi->common).current_frame.refresh_frame_flags);
                      if (decoder_model->initial_presentation_delay <= 0.0 &&
                          decoder_model->initial_presentation_delay != 0.0) {
                        iVar22 = 0;
                        for (lVar24 = 0; lVar24 != 0xf0; lVar24 = lVar24 + 0x18) {
                          if ((0 < *(int *)((long)&pFVar33->decoder_ref_count + lVar24)) ||
                             (0 < *(int *)((long)&pFVar33->player_ref_count + lVar24))) {
                            iVar22 = iVar22 + 1;
                          }
                        }
                        if (decoder_model->initial_display_delay + -1 <= iVar22) {
                          decoder_model->initial_presentation_delay = decoder_model->current_time;
                          for (lVar24 = 0; lVar24 != 0xf0; lVar24 = lVar24 + 0x18) {
                            if (*(int *)((long)pdVar36 + lVar24 + -0xc) != 0) {
                              dVar43 = get_presentation_time
                                                 (decoder_model,
                                                  *(int *)((long)pdVar36 + lVar24 + -8));
                              *(double *)((long)pdVar36 + lVar24) = dVar43;
                            }
                          }
                        }
                      }
                      goto LAB_001b64da;
                    }
                    pFVar25 = pFVar25 + 1;
                  }
                  decoder_model->status = '\x02';
                }
              }
              else {
                decoder_model->status = '\x05';
              }
            }
            else {
              decoder_model->status = '\x02';
            }
          }
          else {
            lVar38 = (long)decoder_model->vbi[cpi->existing_fb_idx_to_show];
            if (lVar38 < 0) {
              decoder_model->status = '\x03';
            }
            else {
              if (decoder_model->frame_buffer_pool[lVar38].frame_type == '\0') {
                update_ref_buffers(decoder_model,decoder_model->vbi[cpi->existing_fb_idx_to_show],
                                   0xff);
              }
LAB_001b64da:
              if (iVar26 != 0 || iVar17 != 0) {
                iVar26 = (int)lVar38;
                piVar34 = &decoder_model->frame_buffer_pool[iVar26].player_ref_count;
                *piVar34 = *piVar34 + 1;
                iVar17 = decoder_model->num_shown_frame;
                decoder_model->frame_buffer_pool[iVar26].display_index = iVar17;
                dVar43 = get_presentation_time(decoder_model,iVar17);
                decoder_model->frame_buffer_pool[iVar26].presentation_time = dVar43;
                if ((dVar43 < 0.0) || (decoder_model->current_time <= dVar43)) {
                  iVar17 = decoder_model->display_samples;
                  dVar45 = decoder_model->presentation_time;
                  decoder_model->display_samples = iVar16;
                  decoder_model->presentation_time = dVar43;
                  if ((0.0 <= dVar43) && (0.0 <= dVar45)) {
                    dVar45 = (double)iVar17 / (dVar43 - dVar45);
                    dVar43 = decoder_model->max_display_rate;
                    if (decoder_model->max_display_rate <= dVar45) {
                      dVar43 = dVar45;
                    }
                    decoder_model->max_display_rate = dVar43;
                  }
                }
                else {
                  decoder_model->status = '\x04';
                }
              }
            }
          }
        }
        pdVar36 = pdVar36 + 0xf6;
        pFVar33 = pFVar33 + 0x52;
      }
      bVar4 = (pAVar11->level_params).target_seq_level_idx[lVar40];
      if (((bVar4 < 0x1c) && ((cpi->oxcf).strict_level_conformance != 0)) &&
         (TVar20 = check_level_constraints
                             (level_info,bVar4,(uint)pSVar12->tier[lVar40],(uint)bVar3,profile,0),
         TVar20 != TARGET_LEVEL_OK)) {
        aom_internal_error((cpi->common).error,AOM_CODEC_ERROR,
                           "Failed to encode to the target level %d_%d. %s",
                           (ulong)((bVar4 >> 2) + 2),(ulong)(bVar4 & 3),
                           level_fail_messages_rel +
                           *(int *)(level_fail_messages_rel + (ulong)TVar20 * 4));
      }
    }
    lVar40 = lVar40 + 1;
  } while( true );
}

Assistant:

void av1_update_level_info(AV1_COMP *cpi, size_t size, int64_t ts_start,
                           int64_t ts_end) {
  AV1_COMMON *const cm = &cpi->common;
  const AV1LevelParams *const level_params = &cpi->ppi->level_params;

  const int upscaled_width = cm->superres_upscaled_width;
  const int width = cm->width;
  const int height = cm->height;
  const int tile_cols = cm->tiles.cols;
  const int tile_rows = cm->tiles.rows;
  const int tiles = tile_cols * tile_rows;
  const int luma_pic_size = upscaled_width * height;
  const int frame_header_count = cpi->frame_header_count;
  const int show_frame = cm->show_frame;
  const int show_existing_frame = cm->show_existing_frame;

  int max_tile_size;
  int min_cropped_tile_width;
  int min_cropped_tile_height;
  int max_superres_tile_width;
  int tile_width_is_valid;
  get_tile_stats(cm, cpi->tile_data, &max_tile_size, &max_superres_tile_width,
                 &min_cropped_tile_width, &min_cropped_tile_height,
                 &tile_width_is_valid);

  const double compression_ratio = av1_get_compression_ratio(cm, size);

  const int temporal_layer_id = cm->temporal_layer_id;
  const int spatial_layer_id = cm->spatial_layer_id;
  const SequenceHeader *const seq_params = cm->seq_params;
  const BITSTREAM_PROFILE profile = seq_params->profile;
  const int is_still_picture = seq_params->still_picture;
  // update level_stats
  // TODO(kyslov@) fix the implementation according to buffer model
  for (int i = 0; i < seq_params->operating_points_cnt_minus_1 + 1; ++i) {
    if (!is_in_operating_point(seq_params->operating_point_idc[i],
                               temporal_layer_id, spatial_layer_id) ||
        !((level_params->keep_level_stats >> i) & 1)) {
      continue;
    }

    AV1LevelInfo *const level_info = level_params->level_info[i];
    assert(level_info != NULL);
    AV1LevelStats *const level_stats = &level_info->level_stats;

    level_stats->max_tile_size =
        AOMMAX(level_stats->max_tile_size, max_tile_size);
    level_stats->max_superres_tile_width =
        AOMMAX(level_stats->max_superres_tile_width, max_superres_tile_width);
    level_stats->min_cropped_tile_width =
        AOMMIN(level_stats->min_cropped_tile_width, min_cropped_tile_width);
    level_stats->min_cropped_tile_height =
        AOMMIN(level_stats->min_cropped_tile_height, min_cropped_tile_height);
    level_stats->tile_width_is_valid &= tile_width_is_valid;
    level_stats->min_frame_width = AOMMIN(level_stats->min_frame_width, width);
    level_stats->min_frame_height =
        AOMMIN(level_stats->min_frame_height, height);
    level_stats->min_cr = AOMMIN(level_stats->min_cr, compression_ratio);
    level_stats->total_compressed_size += (double)size;

    // update level_spec
    // TODO(kyslov@) update all spec fields
    AV1LevelSpec *const level_spec = &level_info->level_spec;
    level_spec->max_picture_size =
        AOMMAX(level_spec->max_picture_size, luma_pic_size);
    level_spec->max_h_size =
        AOMMAX(level_spec->max_h_size, cm->superres_upscaled_width);
    level_spec->max_v_size = AOMMAX(level_spec->max_v_size, height);
    level_spec->max_tile_cols = AOMMAX(level_spec->max_tile_cols, tile_cols);
    level_spec->max_tiles = AOMMAX(level_spec->max_tiles, tiles);

    // Store info. of current frame into FrameWindowBuffer.
    FrameWindowBuffer *const buffer = &level_info->frame_window_buffer;
    store_frame_record(ts_start, ts_end, size, luma_pic_size,
                       frame_header_count, tiles, show_frame,
                       show_existing_frame, buffer);
    if (show_frame) {
      // Count the number of frames encoded in the past 1 second.
      const int encoded_frames_in_last_second =
          show_frame ? count_frames(buffer, TICKS_PER_SEC) : 0;
      scan_past_frames(buffer, encoded_frames_in_last_second, level_spec,
                       level_stats);
      level_stats->total_time_encoded +=
          (cpi->time_stamps.prev_ts_end - cpi->time_stamps.prev_ts_start) /
          (double)TICKS_PER_SEC;
    }

    DECODER_MODEL *const decoder_models = level_info->decoder_models;
    for (AV1_LEVEL level = SEQ_LEVEL_2_0; level < SEQ_LEVELS; ++level) {
      decoder_model_process_frame(cpi, size << 3, &decoder_models[level]);
    }

    // Check whether target level is met.
    const AV1_LEVEL target_level = level_params->target_seq_level_idx[i];
    if (target_level < SEQ_LEVELS && cpi->oxcf.strict_level_conformance) {
      assert(is_valid_seq_level_idx(target_level));
      const int tier = seq_params->tier[i];
      const TARGET_LEVEL_FAIL_ID fail_id = check_level_constraints(
          level_info, target_level, tier, is_still_picture, profile, 0);
      if (fail_id != TARGET_LEVEL_OK) {
        const int target_level_major = 2 + (target_level >> 2);
        const int target_level_minor = target_level & 3;
        aom_internal_error(cm->error, AOM_CODEC_ERROR,
                           "Failed to encode to the target level %d_%d. %s",
                           target_level_major, target_level_minor,
                           level_fail_messages[fail_id]);
      }
    }
  }
}